

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

int pbrt::readWord(FILE *fp,char *buffer,int bufferLength)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  long in_RSI;
  FILE *in_RDI;
  int c;
  int n;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_4;
  
  if (in_EDX < 1) {
    local_4 = -1;
  }
  else {
    local_20 = 0;
    local_24 = fgetc(in_RDI);
    while( true ) {
      bVar1 = false;
      if (local_24 != -1) {
        iVar2 = isWhitespace((char)local_24);
        bVar1 = false;
        if (iVar2 == 0) {
          bVar1 = local_20 < in_EDX;
        }
      }
      if (!bVar1) break;
      *(char *)(in_RSI + local_20) = (char)local_24;
      local_20 = local_20 + 1;
      local_24 = fgetc(in_RDI);
    }
    if (local_20 < in_EDX) {
      *(undefined1 *)(in_RSI + local_20) = 0;
      local_4 = local_20;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int readWord(FILE *fp, char *buffer, int bufferLength) {
    int n;
    int c;

    if (bufferLength < 1)
        return -1;

    n = 0;
    c = fgetc(fp);
    while (c != EOF && (isWhitespace(c) == 0) && n < bufferLength) {
        buffer[n] = c;
        ++n;
        c = fgetc(fp);
    }

    if (n < bufferLength) {
        buffer[n] = '\0';
        return n;
    }

    return -1;
}